

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

xmlXPathObjectPtr xmlXPtrEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlXPathContextPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  xmlXPathParserContextPtr ctxt;
  xmlXPathObjectPtr *ppxVar3;
  xmlChar *str1;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  ulong uVar7;
  xmlChar *pxVar8;
  byte *ns_uri;
  int iVar9;
  xmlChar xVar10;
  xmlChar *pxVar11;
  byte *pbVar12;
  
  xmlInitParser();
  if ((str == (xmlChar *)0x0 || ctx == (xmlXPathContextPtr)0x0) ||
     (ctxt = xmlXPathNewParserContext(str,ctx), ctxt == (xmlXPathParserContextPtr)0x0)) {
    return (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt->valueTab = ppxVar3;
    if (ppxVar3 == (xmlXPathObjectPtr *)0x0) {
      xmlXPtrErrMemory("allocating evaluation context");
      goto LAB_001d9f96;
    }
    ctxt->valueNr = 0;
    ctxt->valueMax = 10;
    ctxt->value = (xmlXPathObjectPtr)0x0;
    ctxt->valueFrame = 0;
  }
  pbVar12 = ctxt->cur;
  while( true ) {
    uVar7 = (ulong)*pbVar12;
    if (0x2f < uVar7) break;
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
      if (uVar7 == 0x2f) {
        xmlXPathRoot(ctxt);
        str1 = (xmlChar *)0x0;
        goto LAB_001d9f66;
      }
      break;
    }
    ctxt->cur = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  }
  str1 = xmlXPathParseName(ctxt);
  if (str1 != (xmlChar *)0x0) {
    if (*ctxt->cur == '(') {
LAB_001d9bb1:
      if (str1 != (xmlChar *)0x0) {
        ctxt->error = 0;
        if (*ctxt->cur != '(') goto LAB_001d9e3e;
        pxVar11 = ctxt->cur + 1;
        ctxt->cur = pxVar11;
        iVar9 = xmlStrlen(pxVar11);
        pxVar11 = (xmlChar *)(*xmlMallocAtomic)((long)(iVar9 + 1));
        if (pxVar11 != (xmlChar *)0x0) {
          pxVar8 = ctxt->cur;
          iVar9 = 1;
          pxVar4 = pxVar11;
LAB_001d9bf1:
          xVar10 = *pxVar8;
          if (xVar10 == '(') {
            iVar9 = iVar9 + 1;
            xVar10 = '(';
          }
          else if (xVar10 == ')') {
            xVar10 = ')';
            iVar9 = iVar9 + -1;
            if (iVar9 == 0) {
              ctxt->cur = pxVar8 + 1;
              *pxVar4 = '\0';
              goto LAB_001d9ca5;
            }
          }
          else if (xVar10 == '^') {
            xVar10 = '^';
            if ((pxVar8[1] - 0x28 < 0x37) &&
               ((0x40000000000003U >> ((ulong)(pxVar8[1] - 0x28) & 0x3f) & 1) != 0)) {
              ctxt->cur = pxVar8 + 1;
              xVar10 = pxVar8[1];
            }
          }
          else if (xVar10 == '\0') goto LAB_001d9c6b;
          *pxVar4 = xVar10;
          pxVar4 = pxVar4 + 1;
          pxVar8 = ctxt->cur;
          if (*pxVar8 != '\0') {
            pxVar8 = pxVar8 + 1;
            ctxt->cur = pxVar8;
          }
          goto LAB_001d9bf1;
        }
        xmlXPtrErrMemory("allocating buffer");
        goto LAB_001d9d13;
      }
      goto LAB_001d9f96;
    }
LAB_001d9f66:
    xmlXPtrEvalChildSeq(ctxt,str1);
    pbVar12 = ctxt->cur;
    while( true ) {
      uVar7 = (ulong)*pbVar12;
      if (0x20 < uVar7) break;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0) goto LAB_001d9f96;
        break;
      }
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
  }
  xmlXPathErr(ctxt,7);
LAB_001d9f96:
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type == XPATH_NODESET)) {
    pxVar6 = valuePop(ctxt);
  }
  else {
    pxVar6 = (xmlXPathObjectPtr)0x0;
    xmlXPtrErr(ctxt,0x76e,"xmlXPtrEval: evaluation failed to return a node set\n",(xmlChar *)0x0);
  }
  iVar9 = 0;
  while (obj = valuePop(ctxt), obj != (xmlXPathObjectPtr)0x0) {
    if ((((obj->type != XPATH_NODESET) || (pxVar2 = obj->nodesetval, pxVar2 == (xmlNodeSetPtr)0x0))
        || (pxVar2->nodeNr != 1)) || ((xmlDocPtr)*pxVar2->nodeTab != ctx->doc)) {
      iVar9 = iVar9 + 1;
    }
    xmlXPathFreeObject(obj);
  }
  if (iVar9 != 0) {
    xmlXPtrErr(ctxt,0x76f,"xmlXPtrEval: object(s) left on the eval stack\n",(xmlChar *)0x0);
  }
  if (ctxt->error != 0) {
    xmlXPathFreeObject(pxVar6);
    pxVar6 = (xmlXPathObjectPtr)0x0;
  }
  xmlXPathFreeParserContext(ctxt);
  return pxVar6;
LAB_001d9c6b:
  *pxVar4 = '\0';
  if ((iVar9 != 0) && (*ctxt->cur == '\0')) {
    (*xmlFree)(str1);
    (*xmlFree)(pxVar11);
LAB_001d9c92:
    iVar9 = 0x10;
LAB_001d9e49:
    xmlXPathErr(ctxt,iVar9);
    goto LAB_001d9e4f;
  }
LAB_001d9ca5:
  iVar9 = xmlStrEqual(str1,(xmlChar *)"xpointer");
  if ((iVar9 == 0) && (iVar9 = xmlStrEqual(str1,(xmlChar *)"xpath1"), iVar9 == 0)) {
    iVar9 = xmlStrEqual(str1,"element");
    if (iVar9 == 0) {
      iVar9 = xmlStrEqual(str1,"xmlns");
      if (iVar9 != 0) {
        pxVar8 = ctxt->cur;
        pxVar4 = ctxt->base;
        ctxt->base = pxVar11;
        ctxt->cur = pxVar11;
        pxVar5 = xmlXPathParseNCName(ctxt);
        if (pxVar5 == (xmlChar *)0x0) {
          ctxt->base = pxVar4;
          ctxt->cur = pxVar8;
        }
        else {
          pbVar12 = ctxt->cur;
          ns_uri = pbVar12;
          while( true ) {
            ns_uri = ns_uri + 1;
            uVar7 = (ulong)*pbVar12;
            if (0x3d < uVar7) break;
            if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
              if (uVar7 == 0x3d) goto LAB_001d9ec8;
              break;
            }
            pbVar12 = pbVar12 + 1;
            ctxt->cur = pbVar12;
          }
          ctxt->base = pxVar4;
          ctxt->cur = pxVar8;
          (*xmlFree)(pxVar5);
        }
        (*xmlFree)(pxVar11);
        (*xmlFree)(str1);
        goto LAB_001d9c92;
      }
      xmlXPtrErr(ctxt,0x76c,"unsupported scheme \'%s\'\n",str1);
    }
    else {
      pxVar8 = ctxt->cur;
      pxVar4 = ctxt->base;
      ctxt->base = pxVar11;
      ctxt->cur = pxVar11;
      if (*pxVar11 == '/') {
        xmlXPathRoot(ctxt);
        pxVar5 = (xmlChar *)0x0;
      }
      else {
        pxVar5 = xmlXPathParseName(ctxt);
        if (pxVar5 == (xmlChar *)0x0) {
          ctxt->base = pxVar4;
          ctxt->cur = pxVar8;
          (*xmlFree)(pxVar11);
LAB_001d9e3e:
          (*xmlFree)(str1);
          iVar9 = 7;
          goto LAB_001d9e49;
        }
      }
      xmlXPtrEvalChildSeq(ctxt,pxVar5);
      ctxt->base = pxVar4;
      ctxt->cur = pxVar8;
    }
  }
  else {
    pxVar1 = ctxt->context;
    pxVar1->node = (xmlNodePtr)pxVar1->doc;
    pxVar1->contextSize = 1;
    pxVar1->proximityPosition = 1;
    pxVar8 = ctxt->cur;
    pxVar4 = ctxt->base;
    ctxt->base = pxVar11;
    ctxt->cur = pxVar11;
    xmlXPathEvalExpr(ctxt);
    ctxt->cur = pxVar8;
    ctxt->base = pxVar4;
  }
  goto LAB_001d9d03;
LAB_001d9ec8:
  while( true ) {
    ctxt->cur = ns_uri;
    if ((0x20 < (ulong)*ns_uri) || ((0x100002600U >> ((ulong)*ns_uri & 0x3f) & 1) == 0)) break;
    ns_uri = ns_uri + 1;
  }
  xmlXPathRegisterNs(ctxt->context,pxVar5,ns_uri);
  ctxt->base = pxVar4;
  ctxt->cur = pxVar8;
  (*xmlFree)(pxVar5);
LAB_001d9d03:
  (*xmlFree)(pxVar11);
LAB_001d9d13:
  (*xmlFree)(str1);
LAB_001d9e4f:
  if ((ctxt->error != 0x76c) && (ctxt->error != 0)) goto LAB_001d9f96;
  pxVar6 = ctxt->value;
  if (pxVar6 != (xmlXPathObjectPtr)0x0) {
    if (((pxVar6->type == XPATH_NODESET) && (pxVar6->nodesetval != (xmlNodeSetPtr)0x0)) &&
       (0 < pxVar6->nodesetval->nodeNr)) goto LAB_001d9f96;
    while (pxVar6 = valuePop(ctxt), pxVar6 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar6);
    }
  }
  pbVar12 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  }
  str1 = xmlXPathParseName(ctxt);
  goto LAB_001d9bb1;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res = NULL, tmp;
    xmlXPathObjectPtr init = NULL;
    int stack = 0;

    xmlInitParser();

    if ((ctx == NULL) || (str == NULL))
	return(NULL);

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
	return(NULL);
    xmlXPtrEvalXPointer(ctxt);

    if ((ctxt->value != NULL) &&
#ifdef LIBXML_XPTR_LOCS_ENABLED
	(ctxt->value->type != XPATH_LOCATIONSET) &&
#endif
	(ctxt->value->type != XPATH_NODESET)) {
        xmlXPtrErr(ctxt, XML_XPTR_EVAL_FAILED,
		"xmlXPtrEval: evaluation failed to return a node set\n",
		   NULL);
    } else {
	res = valuePop(ctxt);
    }

    do {
        tmp = valuePop(ctxt);
	if (tmp != NULL) {
	    if (tmp != init) {
		if (tmp->type == XPATH_NODESET) {
		    /*
		     * Evaluation may push a root nodeset which is unused
		     */
		    xmlNodeSetPtr set;
		    set = tmp->nodesetval;
		    if ((set == NULL) || (set->nodeNr != 1) ||
			(set->nodeTab[0] != (xmlNodePtr) ctx->doc))
			stack++;
		} else
		    stack++;
	    }
	    xmlXPathFreeObject(tmp);
        }
    } while (tmp != NULL);
    if (stack != 0) {
        xmlXPtrErr(ctxt, XML_XPTR_EXTRA_OBJECTS,
		   "xmlXPtrEval: object(s) left on the eval stack\n",
		   NULL);
    }
    if (ctxt->error != XPATH_EXPRESSION_OK) {
	xmlXPathFreeObject(res);
	res = NULL;
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}